

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataCollection::InitializeAppend
          (TupleDataCollection *this,TupleDataAppendState *append_state,
          TupleDataPinProperties properties)

{
  vector<unsigned_long,_true> column_ids;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllColumnIDs(this,(vector<unsigned_long,_true> *)&local_58);
  local_38._M_impl.super__Vector_impl_data._M_start =
       local_58._M_impl.super__Vector_impl_data._M_start;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       local_58._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitializeAppend(this,append_state,(vector<unsigned_long,_true> *)&local_38,properties);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void TupleDataCollection::InitializeAppend(TupleDataAppendState &append_state, TupleDataPinProperties properties) {
	vector<column_t> column_ids;
	GetAllColumnIDs(column_ids);
	InitializeAppend(append_state, std::move(column_ids), properties);
}